

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void __thiscall
duckdb::ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_>::ModeAdd
          (ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *this,idx_t row)

{
  ulong uVar1;
  size_t sVar2;
  unsigned_short *__k;
  mapped_type *pmVar3;
  unsigned_short *puVar4;
  ulong uVar5;
  
  __k = GetCell(this,row);
  pmVar3 = ::std::__detail::
           _Map_base<unsigned_short,_std::pair<const_unsigned_short,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_short,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->frequency_map,__k);
  sVar2 = pmVar3->count;
  uVar1 = sVar2 + 1;
  pmVar3->count = uVar1;
  if (sVar2 == 0) {
    this->nonzero = this->nonzero + 1;
    pmVar3->first_row = row;
  }
  else {
    uVar5 = pmVar3->first_row;
    if (row < pmVar3->first_row) {
      uVar5 = row;
    }
    pmVar3->first_row = uVar5;
  }
  if (this->count < uVar1) {
    this->valid = true;
    this->count = uVar1;
    if (this->mode == (unsigned_short *)0x0) {
      puVar4 = (unsigned_short *)operator_new(2);
      *puVar4 = *__k;
      this->mode = puVar4;
    }
    else {
      *this->mode = *__k;
    }
  }
  return;
}

Assistant:

void ModeAdd(idx_t row) {
		const auto &key = GetCell(row);
		auto &attr = (*frequency_map)[key];
		auto new_count = (attr.count += 1);
		if (new_count == 1) {
			++nonzero;
			attr.first_row = row;
		} else {
			attr.first_row = MinValue(row, attr.first_row);
		}
		if (new_count > count) {
			valid = true;
			count = new_count;
			if (mode) {
				*mode = key;
			} else {
				mode = new KEY_TYPE(key);
			}
		}
	}